

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeTranslator.h
# Opt level: O0

uint8_t * __thiscall
arangodb::velocypack::AttributeTranslator::translate(AttributeTranslator *this,string_view key)

{
  bool bVar1;
  reference pvVar2;
  const_iterator it;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*>_>_>
  *in_stack_ffffffffffffffb8;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*>,_true>
  local_28 [4];
  uchar *local_8;
  
  local_28[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*>_>_>
       ::find(in_stack_ffffffffffffffb8,(key_type *)0x11e2bb);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*>_>_>
       ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::__detail::operator==(local_28,&local_30);
  if (bVar1) {
    local_8 = (uchar *)0x0;
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*>,_false,_true>
             ::operator*((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_unsigned_char_*>,_false,_true>
                          *)0x11e309);
    local_8 = pvVar2->second;
  }
  return local_8;
}

Assistant:

uint8_t const* translate(std::string_view key) const noexcept {
    auto it = _keyToId.find(key);

    if (it == _keyToId.end()) {
      return nullptr;
    }

    return (*it).second;
  }